

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O3

double * inform_local_mutual_info(int *series,size_t l,size_t n,int *b,double *mi,inform_error *err)

{
  int *piVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  int iVar4;
  uint32_t *puVar5;
  _Bool _Var6;
  double *__ptr;
  void *__ptr_00;
  inform_dist *piVar7;
  int *piVar8;
  size_t i;
  size_t sVar9;
  size_t sVar10;
  int *piVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  inform_dist *local_50;
  uint64_t *local_48;
  
  _Var6 = check_arguments(series,l,n,b,err);
  if (!_Var6) {
    __ptr = mi;
    if (((mi == (double *)0x0) && (__ptr = (double *)malloc(n * 8), __ptr == (double *)0x0)) ||
       (__ptr_00 = malloc(l * 8), __ptr_00 == (void *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      if (l == 0) {
        local_50 = inform_dist_alloc(1);
        if (local_50 != (inform_dist *)0x0) {
          local_50->counts = n;
LAB_00105723:
          local_48 = &local_50->counts;
          if (n != 0) {
            puVar5 = local_50->histogram;
            sVar9 = 0;
            piVar8 = series;
            do {
              if (l == 0) {
                lVar12 = 0;
              }
              else {
                sVar10 = 0;
                lVar12 = 0;
                piVar11 = piVar8;
                do {
                  lVar12 = b[sVar10] * lVar12 + (long)*piVar11;
                  piVar1 = (int *)(**(long **)((long)__ptr_00 + sVar10 * 8) + (long)*piVar11 * 4);
                  *piVar1 = *piVar1 + 1;
                  sVar10 = sVar10 + 1;
                  piVar11 = piVar11 + n;
                } while (l != sVar10);
              }
              puVar5[lVar12] = puVar5[lVar12] + 1;
              sVar9 = sVar9 + 1;
              piVar8 = piVar8 + 1;
            } while (sVar9 != n);
          }
          dVar14 = 1.0;
          if (l != 0) {
            sVar9 = 0;
            do {
              uVar2 = *(undefined8 *)(*(long *)((long)__ptr_00 + sVar9 * 8) + 0x10);
              dVar14 = dVar14 * (((double)CONCAT44(0x45300000,(int)((ulong)uVar2 >> 0x20)) -
                                 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
              sVar9 = sVar9 + 1;
            } while (l != sVar9);
          }
          if (n != 0) {
            uVar3 = *local_48;
            sVar9 = 0;
            do {
              if (l == 0) {
                dVar13 = 1.0;
                lVar12 = 0;
              }
              else {
                sVar10 = 0;
                lVar12 = 0;
                dVar13 = 1.0;
                piVar8 = series;
                do {
                  dVar13 = dVar13 * (double)*(uint *)(**(long **)((long)__ptr_00 + sVar10 * 8) +
                                                     (long)*piVar8 * 4);
                  lVar12 = b[sVar10] * lVar12 + (long)*piVar8;
                  sVar10 = sVar10 + 1;
                  piVar8 = piVar8 + n;
                } while (l != sVar10);
              }
              dVar13 = log2(((double)local_50->histogram[lVar12] *
                            (dVar14 / (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) -
                                       1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)
                                      ))) / dVar13);
              __ptr[sVar9] = dVar13;
              sVar9 = sVar9 + 1;
              series = series + 1;
            } while (sVar9 != n);
          }
          inform_dist_free(local_50);
          if (l != 0) {
            sVar9 = 0;
            do {
              inform_dist_free(*(inform_dist **)((long)__ptr_00 + sVar9 * 8));
              sVar9 = sVar9 + 1;
            } while (l != sVar9);
          }
          free(__ptr_00);
          return __ptr;
        }
      }
      else {
        sVar9 = 1;
        sVar10 = 0;
        do {
          iVar4 = b[sVar10];
          piVar7 = inform_dist_alloc((long)iVar4);
          *(inform_dist **)((long)__ptr_00 + sVar10 * 8) = piVar7;
          if (piVar7 == (inform_dist *)0x0) {
            if (sVar10 != 0) {
              sVar9 = 0;
              do {
                inform_dist_free(*(inform_dist **)((long)__ptr_00 + sVar9 * 8));
                sVar9 = sVar9 + 1;
              } while (sVar10 != sVar9);
            }
            goto joined_r0x001057fe;
          }
          sVar9 = sVar9 * (long)iVar4;
          sVar10 = sVar10 + 1;
        } while (l != sVar10);
        local_50 = inform_dist_alloc(sVar9);
        if (local_50 != (inform_dist *)0x0) {
          local_50->counts = n;
          sVar9 = 0;
          do {
            *(size_t *)(*(long *)((long)__ptr_00 + sVar9 * 8) + 0x10) = n;
            sVar9 = sVar9 + 1;
          } while (l != sVar9);
          goto LAB_00105723;
        }
        sVar9 = 0;
        do {
          inform_dist_free(*(inform_dist **)((long)__ptr_00 + sVar9 * 8));
          sVar9 = sVar9 + 1;
        } while (l != sVar9);
      }
joined_r0x001057fe:
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      if (mi == (double *)0x0) {
        free(__ptr);
      }
      free(__ptr_00);
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_mutual_info(int const *series, size_t l, size_t n,
    int const *b, double *mi, inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NULL;

    bool allocate_mi = (mi == NULL);
    if (allocate_mi)
    {
        mi = malloc(n * sizeof(double));
        if (mi == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        if (allocate_mi) free(mi);
        free(marginals);
        return NULL;
    }

    accumulate(series, l, n, b, joint, marginals);

    double norm = 1;
    for (size_t i = 0; i < l; ++i) norm *= marginals[i]->counts;
    norm /= joint->counts;

    double j, m;
    for (size_t i = 0; i < n; ++i)
    {
        m = 1;
        size_t joint_event = 0;
        for (size_t j = 0; j < l; ++j)
        {
            int marginal_event = series[i + n * j];
            m *= marginals[j]->histogram[marginal_event];
            joint_event = joint_event * b[j] + marginal_event;
        }
        j = joint->histogram[joint_event];
        mi[i] = log2((j * norm) / m);
    }

    free_all(&joint, marginals, l);

    return mi;
}